

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t mime_file_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  int iVar1;
  curl_mimepart *part;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  if (nitems == 0) {
    buffer_local = (char *)0xfffffffffffffffe;
  }
  else {
    iVar1 = mime_open_file((curl_mimepart *)instream);
    if (iVar1 == 0) {
      buffer_local = (char *)fread(buffer,size,nitems,*(FILE **)((long)instream + 0x40));
    }
    else {
      buffer_local = (char *)0xffffffffffffffff;
    }
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t mime_file_read(char *buffer, size_t size, size_t nitems,
                             void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(!nitems)
    return STOP_FILLING;

  if(mime_open_file(part))
    return READ_ERROR;

  return fread(buffer, size, nitems, part->fp);
}